

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O1

void __thiscall deqp::egl::anon_unknown_0::TestThread::run(TestThread *this)

{
  TestContext *pTVar1;
  GLenum err;
  deUint32 err_00;
  deUint64 dVar2;
  pointer ppTVar3;
  Library *pLVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  dVar2 = deGetMicroseconds();
  this->m_beginTimeUs = dVar2;
  ppTVar3 = (this->m_contexts).
            super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_contexts).
                              super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3) >> 3)) {
    lVar5 = 0;
    do {
      pTVar1 = ppTVar3[lVar5];
      pLVar4 = EglTestContext::getLibrary(pTVar1->m_testCtx);
      (*pLVar4->_vptr_Library[0x27])(pLVar4,pTVar1->m_eglDisplay,pTVar1->m_eglSurface);
      if (0 < (pTVar1->m_config).frameCount) {
        iVar6 = 0;
        do {
          (*(pTVar1->m_gl).clearColor)(0.75,0.6,0.5,1.0);
          (*(pTVar1->m_gl).clear)(0x4100);
          if (0 < (pTVar1->m_config).drawCallCount) {
            iVar7 = 0;
            do {
              (*(pTVar1->m_gl).useProgram)(pTVar1->m_program);
              (*(pTVar1->m_gl).enableVertexAttribArray)(pTVar1->m_coordLoc);
              if ((pTVar1->m_config).useCoordBuffer == true) {
                (*(pTVar1->m_gl).bindBuffer)(0x8892,pTVar1->m_coordBuffer);
                (*(pTVar1->m_gl).vertexAttribPointer)
                          (pTVar1->m_coordLoc,2,0x1406,'\0',0,(void *)0x0);
                (*(pTVar1->m_gl).bindBuffer)(0x8892,0);
              }
              else {
                (*(pTVar1->m_gl).vertexAttribPointer)
                          (pTVar1->m_coordLoc,2,0x1406,'\0',0,
                           (pTVar1->m_coordData).super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start);
              }
              if ((pTVar1->m_config).useTexture == true) {
                (*(pTVar1->m_gl).bindTexture)(0xde1,pTVar1->m_texture);
                (*(pTVar1->m_gl).uniform1i)(pTVar1->m_textureLoc,0);
              }
              if ((pTVar1->m_config).useIndices == true) {
                if ((pTVar1->m_config).useIndexBuffer == true) {
                  (*(pTVar1->m_gl).bindBuffer)(0x8893,pTVar1->m_indexBuffer);
                  (*(pTVar1->m_gl).drawElements)
                            (4,(pTVar1->m_config).triangleCount,0x1403,(void *)0x0);
                }
                else {
                  (*(pTVar1->m_gl).drawElements)
                            (4,(pTVar1->m_config).triangleCount,0x1403,
                             (pTVar1->m_indexData).
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start);
                }
              }
              else {
                (*(pTVar1->m_gl).drawArrays)(4,0,(pTVar1->m_config).triangleCount);
              }
              if ((pTVar1->m_config).useTexture == true) {
                (*(pTVar1->m_gl).bindTexture)(0xde1,0);
              }
              (*(pTVar1->m_gl).disableVertexAttribArray)(pTVar1->m_coordLoc);
              (*(pTVar1->m_gl).useProgram)(0);
              iVar7 = iVar7 + 1;
            } while (iVar7 < (pTVar1->m_config).drawCallCount);
          }
          (*pLVar4->_vptr_Library[0x31])(pLVar4,pTVar1->m_eglDisplay,pTVar1->m_eglSurface);
          iVar6 = iVar6 + 1;
        } while (iVar6 < (pTVar1->m_config).frameCount);
      }
      (*(pTVar1->m_gl).finish)();
      err = (*(pTVar1->m_gl).getError)();
      glu::checkError(err,"glFinish()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                      ,0x2c9);
      (*pLVar4->_vptr_Library[0x27])(pLVar4,pTVar1->m_eglDisplay,0,0,0);
      err_00 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
      eglu::checkError(err_00,
                       "makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                       ,0x2ca);
      lVar5 = lVar5 + 1;
      ppTVar3 = (this->m_contexts).
                super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar5 < (int)((ulong)((long)(this->m_contexts).
                                         super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3)
                          >> 3));
  }
  this->m_isOk = true;
  dVar2 = deGetMicroseconds();
  this->m_endTimeUs = dVar2;
  return;
}

Assistant:

void TestThread::run (void)
{
	try
	{
		m_beginTimeUs = deGetMicroseconds();

		for (int contextNdx = 0; contextNdx < (int)m_contexts.size(); contextNdx++)
			m_contexts[contextNdx]->render();

		m_isOk		= true;
		m_endTimeUs = deGetMicroseconds();
	}
	catch (const std::runtime_error& error)
	{
		m_isOk			= false;
		m_errorString	= error.what();
	}
	catch (...)
	{
		m_isOk			= false;
		m_errorString	= "Got unknown exception";
	}
}